

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O2

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  int k;
  ulong uVar7;
  int k_1;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  undefined1 in_XMM2 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> count;
  allocator_type local_79;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uStack_38;
  undefined4 local_34;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"jo\tja\ts\'\tP");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar9 = 0;
  while( true ) {
    uVar6 = (**(code **)(*(long *)decpomdp + 0xd0))(decpomdp);
    if (uVar6 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      uVar6 = (**(code **)(*(long *)decpomdp + 0x70))(decpomdp);
      if (uVar6 <= uVar8) break;
      uVar4 = 0;
      while( true ) {
        uVar6 = (**(code **)(*(long *)decpomdp + 0x30))(decpomdp);
        if (uVar6 <= uVar4) break;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar5 = std::operator<<(poVar5,"\t");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"\t");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,"\t");
        dVar13 = (double)(**(code **)(*(long *)decpomdp + 0x128))
                                   (decpomdp,(ulong)uVar8,(ulong)uVar4,(ulong)uVar9);
        poVar5 = std::ostream::_M_insert<double>(dVar13);
        std::endl<char,std::char_traits<char>>(poVar5);
        uVar4 = uVar4 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  uVar9 = (**(code **)(*(long *)decpomdp + 0xd0))(decpomdp);
  local_58 = (ulong)local_58._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(long)(int)uVar9,
             (value_type_conflict3 *)&local_58,&local_79);
  uVar6 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x100000000;
  uStack_40 = 0x100000001;
  uStack_38 = 1;
  local_34 = 1;
  for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
    uVar1 = *(undefined4 *)((long)&local_58 + lVar11 * 4);
    uVar2 = (&DAT_001074a0)[lVar11];
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      local_78._M_impl.super__Vector_impl_data._M_start[uVar7] = 0;
    }
    iVar10 = 100000;
    local_60 = lVar11;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
      uVar9 = (**(code **)(*(long *)decpomdp + 0x140))(decpomdp,uVar2,uVar1);
      local_78._M_impl.super__Vector_impl_data._M_start[uVar9] =
           local_78._M_impl.super__Vector_impl_data._M_start[uVar9] + 1;
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    lVar11 = local_60;
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\t");
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar5,"\t");
    }
    std::operator<<((ostream *)&std::cout," prob ");
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,local_78._M_impl.super__Vector_impl_data._M_start[uVar7]);
      poVar5 = std::ostream::_M_insert<double>(auVar3._0_8_ / 100000.0);
      std::operator<<(poVar5,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)
{
    cout << "jo\tja\ts'\tP"<<endl;
    for(Index jo_i = 0; jo_i < decpomdp->GetNrJointObservations(); jo_i++)
        for(Index ja_i = 0; ja_i < decpomdp->GetNrJointActions(); ja_i++)
            for(Index s_ip = 0; s_ip < decpomdp->GetNrStates(); s_ip++)
                cout << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" <<
                    decpomdp->GetObservationProbability(ja_i, s_ip, jo_i) << endl;
  
    int nrJO=decpomdp->GetNrJointObservations();
    vector<Index> count(nrJO,0);
    Index states[10]={0,0,0,0,0,1,1,1,1,1};
    Index jointActions[10]={0,1,2,3,4,6,4,1,2,4};
    Index jo,si,ja;
    int nrRuns=NRRUNS;

    for(int j=0;j<10;j++)
    {
        si=states[j];
        ja=jointActions[j];
        for(int k=0;k<nrJO;k++)
            count[k]=0;

        for(int i=0;i<nrRuns;i++)
        {
            jo=decpomdp->SampleJointObservation(ja,si);
            count[jo]++;
        }
        cout << ja << "\t" << si << "\t";
        for(int k=0;k<nrJO;k++)
            cout << count[k] << "\t";
        cout << " prob ";
        for(int k=0;k<nrJO;k++)
            cout << ((double)count[k]/nrRuns) << "\t";
        cout << endl;
    }

}